

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetConstant
          (ConstantManager *this,Type *type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words_or_ids)

{
  Constant *pCVar1;
  _Head_base<0UL,_spvtools::opt::analysis::Constant_*,_false> local_20;
  IRContext *local_18;
  
  CreateConstant((ConstantManager *)&stack0xffffffffffffffe8,(Type *)this,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)type);
  if (local_18 == (IRContext *)0x0) {
    pCVar1 = (Constant *)0x0;
  }
  else {
    local_20._M_head_impl = (Constant *)local_18;
    pCVar1 = RegisterConstant(this,(unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
                                    *)&local_20);
    if ((IRContext *)local_20._M_head_impl != (IRContext *)0x0) {
      (*(code *)((spv_context)(local_20._M_head_impl)->_vptr_Constant)->opcode_table)();
    }
  }
  return pCVar1;
}

Assistant:

const Constant* ConstantManager::GetConstant(
    const Type* type, const std::vector<uint32_t>& literal_words_or_ids) {
  auto cst = CreateConstant(type, literal_words_or_ids);
  return cst ? RegisterConstant(std::move(cst)) : nullptr;
}